

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * common_detokenize_abi_cxx11_
                   (llama_vocab *vocab,vector<int,_std::allocator<int>_> *tokens,bool special)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  int32_t n_chars;
  string *text;
  size_type local_30;
  unsigned_long local_28;
  undefined1 local_1a;
  byte local_19;
  vector<int,_std::allocator<int>_> *local_18;
  undefined8 local_10;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = std::__cxx11::string::capacity();
  local_30 = std::vector<int,_std::allocator<int>_>::size(local_18);
  std::max<unsigned_long>(&local_28,&local_30);
  std::__cxx11::string::resize((ulong)in_RDI);
  uVar7 = local_10;
  piVar4 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x16a585);
  sVar5 = std::vector<int,_std::allocator<int>_>::size(local_18);
  uVar6 = std::__cxx11::string::operator[]((ulong)in_RDI);
  uVar1 = std::__cxx11::string::size();
  iVar2 = llama_detokenize(uVar7,piVar4,sVar5 & 0xffffffff,uVar6,uVar1,0,local_19 & 1);
  if (iVar2 < 0) {
    std::__cxx11::string::resize((ulong)in_RDI);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x16a633);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(local_18);
    uVar7 = std::__cxx11::string::operator[]((ulong)in_RDI);
    uVar1 = std::__cxx11::string::size();
    iVar2 = llama_detokenize(local_10,piVar4,sVar5 & 0xffffffff,uVar7,uVar1,0,local_19 & 1);
    iVar3 = std::__cxx11::string::size();
    if (iVar3 < iVar2) {
      uVar7 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/common.cpp"
                         ,0x514,"GGML_ASSERT(%s) failed","n_chars <= (int32_t)text.size()");
      std::__cxx11::string::~string((string *)in_RDI);
      _Unwind_Resume(uVar7);
    }
  }
  std::__cxx11::string::resize((ulong)in_RDI);
  return in_RDI;
}

Assistant:

std::string common_detokenize(const struct llama_vocab * vocab, const std::vector<llama_token> & tokens, bool special) {
    std::string text;
    text.resize(std::max(text.capacity(), tokens.size()));
    int32_t n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
    if (n_chars < 0) {
        text.resize(-n_chars);
        n_chars = llama_detokenize(vocab, tokens.data(), (int32_t)tokens.size(), &text[0], (int32_t)text.size(), false, special);
        GGML_ASSERT(n_chars <= (int32_t)text.size());  // whitespace trimming is performed after per-token detokenization
    }

    text.resize(n_chars);

    // NOTE: the original tokenizer decodes bytes after collecting the pieces.
    return text;
}